

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O2

void __thiscall SimpleParallelAnalyzer::WorkerThread(SimpleParallelAnalyzer *this)

{
  ParallelAnalyzerClockEdge PVar1;
  ParallelAnalyzerClockEdge PVar2;
  pointer ppAVar3;
  pointer puVar4;
  SimpleParallelAnalyzerSettings *pSVar5;
  pointer pCVar6;
  long lVar7;
  char cVar8;
  U32 UVar9;
  int iVar10;
  AnalyzerChannelData *pAVar11;
  uint64_t sample_number;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  double dVar17;
  Frame frame;
  long lStack_98;
  Frame last_frame;
  undefined6 uStack_76;
  long lStack_70;
  FrameV2 frame_v2;
  
  UVar9 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar9;
  PVar1 = ((this->mSettings)._M_t.
           super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl)->mClockEdge
  ;
  pAVar11 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar11;
  ppAVar3 = (this->mData).
            super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mData).
      super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar3) {
    (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar3;
  }
  puVar4 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar4) {
    (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  std::vector<Channel,_std::allocator<Channel>_>::clear(&this->mDataChannels);
  pSVar5 = (this->mSettings)._M_t.
           super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl;
  pCVar6 = *(pointer *)
            ((long)&(pSVar5->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_> +
            8);
  lVar12 = *(long *)&(pSVar5->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                     _M_impl;
  lVar15 = 0;
  for (uVar14 = 0;
      pSVar5 = (this->mSettings)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl,
      ((ulong)((long)pCVar6 - lVar12) >> 4 & 0xffffffff) != uVar14; uVar14 = uVar14 + 1) {
    lVar7 = *(long *)&(pSVar5->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                      _M_impl;
    Channel::Channel((Channel *)&last_frame,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar8 = Channel::operator!=((Channel *)(lVar7 + lVar15),(Channel *)&last_frame);
    Channel::~Channel((Channel *)&last_frame);
    if (cVar8 != '\0') {
      _last_frame = Analyzer::GetAnalyzerChannelData((Channel *)this);
      std::vector<AnalyzerChannelData*,std::allocator<AnalyzerChannelData*>>::
      emplace_back<AnalyzerChannelData*>
                ((vector<AnalyzerChannelData*,std::allocator<AnalyzerChannelData*>> *)&this->mData,
                 (AnalyzerChannelData **)&last_frame);
      _last_frame = CONCAT62(uStack_76,(short)(1 << ((byte)uVar14 & 0x1f)));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (&this->mDataMasks,(unsigned_short *)&last_frame);
      std::vector<Channel,_std::allocator<Channel>_>::push_back
                (&this->mDataChannels,
                 (value_type *)
                 (*(long *)&(((this->mSettings)._M_t.
                              super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
                              .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>.
                             _M_head_impl)->mDataChannels).
                            super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl + lVar15))
      ;
    }
    lVar15 = lVar15 + 0x10;
  }
  PVar2 = pSVar5->mClockEdge;
  if (PVar2 == PosEdge) {
    iVar10 = AnalyzerChannelData::GetBitState();
    if (iVar10 != 1) goto LAB_00106f2d;
  }
  else {
    if (PVar2 != NegEdge) {
      if (PVar2 != DualEdge) goto LAB_00106f2d;
      DecodeBothEdges(this);
    }
    iVar10 = AnalyzerChannelData::GetBitState();
    if (iVar10 != 0) goto LAB_00106f2d;
  }
  AnalyzerChannelData::AdvanceToNextEdge();
LAB_00106f2d:
  AnalyzerChannelData::AdvanceToNextEdge();
  Frame::Frame(&last_frame);
  bVar13 = true;
  do {
    sample_number = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker
              ((ulonglong)
               (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
               (MarkerType)sample_number,(Channel *)(ulong)((PVar1 == NegEdge) + 4));
    GetWordAtLocation(this,sample_number);
    FrameV2::FrameV2(&frame_v2);
    FrameV2::AddInteger((char *)&frame_v2,0x10a030);
    Frame::Frame(&frame);
    _frame = sample_number;
    cVar8 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar8 == '\0') {
      uVar14 = 10;
      if (!bVar13) {
        lVar12 = (lStack_70 - _last_frame) + 1;
        auVar16._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar16._0_8_ = lVar12;
        auVar16._12_4_ = 0x45300000;
        dVar17 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) * 0.1;
        uVar14 = (ulong)dVar17;
        uVar14 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
        if (uVar14 < 4) {
          uVar14 = 3;
        }
      }
      cVar8 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mClock);
      if (cVar8 == '\0') {
        lStack_98 = (uVar14 - 1) + sample_number;
        if (lStack_98 <= (long)_frame) {
          lStack_98 = _frame + 1;
        }
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)&frame_v2,0x10a030,_frame);
        AnalyzerResults::CommitResults();
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        cVar8 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if (cVar8 != '\0') {
          AnalyzerChannelData::AdvanceToNextEdge();
          lStack_98 = AnalyzerChannelData::GetSampleNumber();
          lStack_98 = lStack_98 + -1;
          AnalyzerResults::AddFrame
                    ((Frame *)(this->mResults)._M_t.
                              super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                              .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                              _M_head_impl);
          AnalyzerResults::AddFrameV2
                    ((FrameV2 *)
                     (this->mResults)._M_t.
                     super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                     .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                     (char *)&frame_v2,0x10a030,_frame);
          AnalyzerResults::CommitResults();
          goto LAB_00107221;
        }
        lStack_98 = AnalyzerChannelData::GetSampleNumber();
        lStack_98 = lStack_98 + -1;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)&frame_v2,0x10a030,_frame);
        AnalyzerResults::CommitResults();
      }
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      cVar8 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      if (cVar8 == '\0') {
        lStack_98 = AnalyzerChannelData::GetSampleNumber();
        lStack_98 = lStack_98 + -1;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)&frame_v2,0x10a030,_frame);
        AnalyzerResults::CommitResults();
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        lStack_98 = AnalyzerChannelData::GetSampleNumber();
        lStack_98 = lStack_98 + -1;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)&frame_v2,0x10a030,_frame);
        AnalyzerResults::CommitResults();
      }
    }
LAB_00107221:
    _last_frame = _frame;
    lStack_70 = lStack_98;
    Analyzer::ReportProgress((ulonglong)this);
    Frame::~Frame(&frame);
    FrameV2::~FrameV2(&frame_v2);
    bVar13 = false;
  } while( true );
}

Assistant:

void SimpleParallelAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();

    AnalyzerResults::MarkerType clock_arrow;
    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
        clock_arrow = AnalyzerResults::DownArrow;
    else
        clock_arrow = AnalyzerResults::UpArrow;


    mClock = GetAnalyzerChannelData( mSettings->mClockChannel );
    mData.clear();
    mDataMasks.clear();
    mDataChannels.clear();

    U32 count = mSettings->mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        if( mSettings->mDataChannels[ i ] != UNDEFINED_CHANNEL )
        {
            mData.push_back( GetAnalyzerChannelData( mSettings->mDataChannels[ i ] ) );
            mDataMasks.push_back( 1 << i );
            mDataChannels.push_back( mSettings->mDataChannels[ i ] );
        }
    }


    U32 num_data_lines = mData.size();

    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
    {
        if( mClock->GetBitState() == BIT_LOW )
            mClock->AdvanceToNextEdge();
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::PosEdge )
    {
        if( mClock->GetBitState() == BIT_HIGH )
            mClock->AdvanceToNextEdge();
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::DualEdge )
    {
        // handling both edges is different enough to warrant a separate implementation.
        DecodeBothEdges();
        return;
    }

    mClock->AdvanceToNextEdge(); // this is the data-valid edge

    Frame last_frame;
    bool is_first_frame = true;
    for( ;; )
    {
        // We always start this loop on an active edge.

        U64 sample = mClock->GetSampleNumber();
        mResults->AddMarker( sample, clock_arrow, mSettings->mClockChannel );

        U16 result = GetWordAtLocation( sample );

        FrameV2 frame_v2;
        frame_v2.AddInteger( "data", result );

        Frame frame;
        frame.mData1 = result;
        frame.mFlags = 0;
        frame.mStartingSampleInclusive = sample;

        // The code in these if/else blocks could be replaced with 2 `AdvanceToNextEdge` calls, but if no more transitions are encountered,
        // the current state will never be output as a frame. These blocks will detect that case in the available data, and output a frame
        // immediately, and then another one once the next active edge sample is known.
        if( !mClock->DoMoreTransitionsExistInCurrentData() )
        {
            // There are no transitions available in the current data. Estimate what the frame size might be as 10 if we haven't seen any
            // frames yet, otherwise use 10% of the last frame size.
            U64 estimated_frame_size = 10;
            if( !is_first_frame )
            {
                U64 last_frame_sample_count = last_frame.mEndingSampleInclusive - last_frame.mStartingSampleInclusive + 1;
                estimated_frame_size = last_frame_sample_count * 0.1;
                if( estimated_frame_size < 3 )
                {
                    estimated_frame_size = 3;
                }
            }

            // Make sure we haven't gone past the end of the _real_ frame. WouldAdvancingCauseTransition can block, in which case more
            // transitions might show up.
            if( mClock->WouldAdvancingCauseTransition( estimated_frame_size ) )
            {
                // Move to inactive edge
                mClock->AdvanceToNextEdge();
                if( mClock->DoMoreTransitionsExistInCurrentData() )
                {
                    // Move to active edge
                    mClock->AdvanceToNextEdge();

                    frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                    mResults->AddFrame( frame );
                    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                    mResults->CommitResults();
                }
                else
                {
                    frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                    mResults->AddFrame( frame );
                    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                    mResults->CommitResults();

                    // Move to active edge
                    mClock->AdvanceToNextEdge();
                }
            }
            else
            {
                frame.mEndingSampleInclusive = sample + estimated_frame_size - 1;
                if( frame.mEndingSampleInclusive <= frame.mStartingSampleInclusive )
                {
                    frame.mEndingSampleInclusive = frame.mStartingSampleInclusive + 1;
                }
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();

                // Move to inactive edge, and then the active edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
            }
        }
        else
        {
            // Move to inactive edge
            mClock->AdvanceToNextEdge();

            if( mClock->DoMoreTransitionsExistInCurrentData() )
            {
                // Move to active edge
                mClock->AdvanceToNextEdge();

                frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();
            }
            else
            {
                frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();

                // Move to active edge
                mClock->AdvanceToNextEdge();
            }
        }

        // Note: mClock should always be at an active edge at this point, and `frame` should have been added.

        is_first_frame = false;
        last_frame = frame;

        ReportProgress( frame.mEndingSampleInclusive );
    }
}